

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
cmELFInternalImpl<cmELFTypes32>::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          cmELFInternalImpl<cmELFTypes32> *this,DynamicEntryList *entries)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  const_iterator local_60;
  char **local_58;
  char *pdyn;
  ELF_Dyn dyn;
  __normal_iterator<const_std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
  local_40;
  const_iterator it;
  DynamicEntryList *entries_local;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  vector<char,_std::allocator<char>_> *result;
  
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
  sVar2 = std::
          vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
          size(entries);
  std::vector<char,_std::allocator<char>_>::reserve(__return_storage_ptr__,sVar2 << 3);
  local_40._M_current =
       (pair<long,_unsigned_long> *)
       std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
       ::begin(entries);
  while( true ) {
    dyn = (ELF_Dyn)std::
                   vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   ::end(entries);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<const_std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
                        *)&dyn);
    if (!bVar1) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
             ::operator->(&local_40);
    pdyn._0_4_ = (undefined4)ppVar3->first;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
             ::operator->(&local_40);
    pdyn._4_4_ = (undefined4)ppVar3->second;
    if (((this->super_cmELFInternal).NeedSwap & 1U) != 0) {
      ByteSwap(this,(ELF_Dyn *)&pdyn);
    }
    local_58 = &pdyn;
    local_68._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end(__return_storage_ptr__);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_60,
               &local_68);
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)__return_storage_ptr__,local_60,(char *)local_58
               ,(char *)(local_58 + 1));
    __gnu_cxx::
    __normal_iterator<const_std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
    ::operator++(&local_40,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> cmELFInternalImpl<Types>::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& entries)
{
  std::vector<char> result;
  result.reserve(sizeof(ELF_Dyn) * entries.size());

  for (cmELF::DynamicEntryList::const_iterator it = entries.begin();
       it != entries.end(); it++) {
    // Store the entry in an ELF_Dyn, byteswap it, then serialize to chars
    ELF_Dyn dyn;
    dyn.d_tag = static_cast<tagtype>(it->first);
    dyn.d_un.d_val = static_cast<tagtype>(it->second);

    if (this->NeedSwap) {
      ByteSwap(dyn);
    }

    char* pdyn = reinterpret_cast<char*>(&dyn);
    result.insert(result.end(), pdyn, pdyn + sizeof(ELF_Dyn));
  }

  return result;
}